

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvastexture.cpp
# Opt level: O0

void __thiscall FCanvasTexture::MakeTexture(FCanvasTexture *this)

{
  ushort uVar1;
  uint uVar2;
  DSimpleCanvas *this_00;
  BYTE *pBVar3;
  size_t in_RSI;
  FCanvasTexture *this_local;
  
  this_00 = (DSimpleCanvas *)DObject::operator_new((DObject *)0x50,in_RSI);
  DSimpleCanvas::DSimpleCanvas
            (this_00,(uint)(this->super_FTexture).Width,(uint)(this->super_FTexture).Height);
  this->Canvas = this_00;
  (*(this->Canvas->super_DCanvas).super_DObject._vptr_DObject[8])();
  GC::AddSoftRoot((DObject *)this->Canvas);
  if ((this->super_FTexture).Width == (this->super_FTexture).Height) {
    uVar1 = (this->super_FTexture).Width;
    uVar2 = DCanvas::GetPitch(&this->Canvas->super_DCanvas);
    if (uVar1 == uVar2) {
      pBVar3 = DCanvas::GetBuffer(&this->Canvas->super_DCanvas);
      this->Pixels = pBVar3;
      this->bPixelsAllocated = false;
      goto LAB_00866579;
    }
  }
  pBVar3 = (BYTE *)operator_new__((long)(int)((uint)(this->super_FTexture).Width *
                                             (uint)(this->super_FTexture).Height));
  this->Pixels = pBVar3;
  this->bPixelsAllocated = true;
LAB_00866579:
  memset(this->Pixels,0,
         (long)((int)((uint)(this->super_FTexture).Width * (uint)(this->super_FTexture).Height) / 2)
        );
  memset(this->Pixels +
         (int)((uint)(this->super_FTexture).Width * (uint)(this->super_FTexture).Height) / 2,0xff,
         (long)((int)((uint)(this->super_FTexture).Width * (uint)(this->super_FTexture).Height) / 2)
        );
  return;
}

Assistant:

void FCanvasTexture::MakeTexture ()
{
	Canvas = new DSimpleCanvas (Width, Height);
	Canvas->Lock ();
	GC::AddSoftRoot(Canvas);
	if (Width != Height || Width != Canvas->GetPitch())
	{
		Pixels = new BYTE[Width*Height];
		bPixelsAllocated = true;
	}
	else
	{
		Pixels = Canvas->GetBuffer();
		bPixelsAllocated = false;
	}
	// Draw a special "unrendered" initial texture into the buffer.
	memset (Pixels, 0, Width*Height/2);
	memset (Pixels+Width*Height/2, 255, Width*Height/2);
}